

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

Trivia __thiscall
slang::parsing::Preprocessor::handleUnconnectedDriveDirective(Preprocessor *this,Token directive)

{
  Token *pTVar1;
  undefined2 uVar2;
  Info *pIVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  SourceLocation SVar7;
  UnconnectedDriveDirectiveSyntax *syntax;
  Token TVar8;
  string_view sVar9;
  Token local_68;
  Token local_58;
  Trivia local_48;
  Token local_38;
  
  local_58.info = directive.info;
  local_58._0_8_ = directive._0_8_;
  checkOutsideDesignElement(this,directive);
  Token::Token(&local_68);
  if ((this->currentToken).info == (Info *)0x0) {
    TVar8 = nextProcessed(this);
    this->currentToken = TVar8;
  }
  if (((undefined1  [16])this->currentToken & (undefined1  [16])0xfffe) == (undefined1  [16])0xf2) {
    pTVar1 = &this->currentToken;
    if ((this->currentToken).info == (Info *)0x0) {
      TVar8 = nextProcessed(this);
      this->currentToken = TVar8;
    }
    uVar2 = (this->currentToken).kind;
    TVar8 = this->currentToken;
    uVar4 = pTVar1->field_0x2;
    NVar5.raw = (pTVar1->numFlags).raw;
    uVar6 = pTVar1->rawLen;
    pIVar3 = (this->currentToken).info;
    (this->lastConsumed).kind = pTVar1->kind;
    (this->lastConsumed).field_0x2 = uVar4;
    (this->lastConsumed).numFlags = (NumericTokenFlags)NVar5.raw;
    (this->lastConsumed).rawLen = uVar6;
    (this->lastConsumed).info = pIVar3;
    Token::Token(&local_38);
    pTVar1->kind = local_38.kind;
    pTVar1->field_0x2 = local_38._2_1_;
    pTVar1->numFlags = (NumericTokenFlags)local_38.numFlags.raw;
    pTVar1->rawLen = local_38.rawLen;
    (this->currentToken).info = local_38.info;
    this->unconnectedDrive = uVar2;
    local_68 = TVar8;
  }
  if (local_68.info == (Info *)0x0) {
    SVar7 = Token::location(&local_58);
    sVar9 = Token::rawText(&local_58);
    SVar7 = (SourceLocation)((long)SVar7 + sVar9._M_len * 0x10000000);
    Diagnostics::add(this->diagnostics,(DiagCode)0x30004,SVar7);
    local_68 = Token::createMissing(this->alloc,Pull0Keyword,SVar7);
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::UnconnectedDriveDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&local_58,&local_68);
  Trivia::Trivia(&local_48,Directive,(SyntaxNode *)syntax);
  return local_48;
}

Assistant:

Trivia Preprocessor::handleUnconnectedDriveDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token strength;
    switch (peek().kind) {
        case TokenKind::Pull0Keyword:
        case TokenKind::Pull1Keyword:
            strength = consume();
            unconnectedDrive = strength.kind;
            break;
        default:
            break;
    }

    if (!strength) {
        auto loc = directive.location() + directive.rawText().length();
        addDiag(diag::ExpectedDriveStrength, loc);
        strength = Token::createMissing(alloc, TokenKind::Pull0Keyword, loc);
    }

    auto result = alloc.emplace<UnconnectedDriveDirectiveSyntax>(directive, strength);
    return Trivia(TriviaKind::Directive, result);
}